

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

OPJ_UINT32 opj_bio_read(opj_bio_t *bio,OPJ_UINT32 n)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  
  if (n != 0) {
    uVar4 = n - 1;
    uVar5 = bio->buf;
    OVar6 = bio->ct;
    uVar3 = 0;
    do {
      if (OVar6 == 0) {
        uVar2 = uVar5 & 0xff;
        uVar5 = uVar2 << 8;
        bio->buf = uVar5;
        OVar6 = (uVar2 != 0xff) + 7;
        bio->ct = OVar6;
        pbVar1 = bio->bp;
        if (pbVar1 < bio->end) {
          bio->bp = pbVar1 + 1;
          uVar5 = uVar5 | *pbVar1;
          bio->buf = uVar5;
        }
      }
      OVar6 = OVar6 - 1;
      bio->ct = OVar6;
      uVar3 = uVar3 | (uint)((uVar5 >> (OVar6 & 0x1f) & 1) != 0) << ((byte)uVar4 & 0x1f);
      uVar4 = uVar4 - 1;
    } while (uVar4 < n);
    return uVar3;
  }
  __assert_fail("(n > 0U)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/bio.c"
                ,0xa9,"OPJ_UINT32 opj_bio_read(opj_bio_t *, OPJ_UINT32)");
}

Assistant:

OPJ_UINT32 opj_bio_read(opj_bio_t *bio, OPJ_UINT32 n) {
	OPJ_UINT32 i;
	OPJ_UINT32 v;
	
	assert((n > 0U) /* && (n <= 32U)*/);
#ifdef OPJ_UBSAN_BUILD
	/* This assert fails for some corrupted images which are gracefully rejected */
	/* Add this assert only for ubsan build. */
	/* This is the condition for overflow not to occur below which is needed because of OPJ_NOSANITIZE */
	assert(n <= 32U);
#endif
	v = 0U;
	for (i = n - 1; i < n; i--) { /* overflow used for end-loop condition */
		v |= opj_bio_getbit(bio) << i; /* can't overflow, opj_bio_getbit returns 0 or 1 */
	}
	return v;
}